

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_util.c
# Opt level: O1

void dec_update_map(com_core_t *core)

{
  uint uVar1;
  u8 uVar2;
  s8 asVar3 [2];
  s8 (*pasVar4) [2];
  u32 *puVar5;
  com_scu_t *pcVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  s16 (*paasVar12) [2] [2];
  s16 (*pasVar13) [2];
  int iVar14;
  int iVar15;
  com_scu_t cVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  long lVar21;
  s8 (*pasVar22) [2];
  uint uVar23;
  uint uVar24;
  int iVar25;
  int iVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  int iVar31;
  int iVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  ulong uVar36;
  ushort uVar37;
  uint uVar38;
  int iVar39;
  int iVar40;
  s16 asVar41 [2];
  long lVar42;
  int iVar43;
  uint uVar44;
  uint uVar45;
  byte bVar46;
  int iVar47;
  uint uVar48;
  uint uVar49;
  int w_sch;
  long lVar50;
  ulong uVar51;
  s32 (*paasVar52) [1024] [2];
  int w_sch_1;
  uint uVar53;
  uint uVar54;
  s16 aasVar55 [2] [2];
  byte bVar56;
  int iVar57;
  int iVar58;
  uint uVar59;
  com_scu_t *__s;
  s32 (*local_138) [1024] [2];
  s16 (*local_110) [2] [2];
  u32 *local_100;
  s32 (*local_e8) [1024] [2];
  s16 (*local_d8) [2] [2];
  
  uVar1 = core->cu_log2w - 2;
  uVar8 = 1 << ((byte)uVar1 & 0x1f);
  iVar31 = core->cu_log2h - 2;
  iVar25 = 1 << ((byte)iVar31 & 0x1f);
  lVar10 = (long)core->cu_scup;
  pasVar4 = (core->map).map_refi;
  puVar5 = (core->map).map_pos;
  pcVar6 = (core->map).map_scu;
  bVar56 = (core->cu_mode != 0) * '\x02' + 3;
  bVar46 = 0x10;
  if ((*(int *)core->cbfy == 0) && (*(short *)core->cbfc == 0)) {
    bVar46 = bVar56 * '\b' & 0x10;
  }
  asVar3 = *&core->refi;
  iVar32 = core->seqhdr->i_scu;
  lVar21 = (long)iVar32;
  pasVar22 = pasVar4 + lVar10;
  cVar16 = (com_scu_t)((core->cu_mode == 2) << 3 | (core->affine_flag & 3) << 5 | bVar46 | bVar56);
  local_100 = puVar5 + lVar10;
  uVar38 = core->cu_scup << 6 | (core->cu_log2w & 7U) + (core->cu_log2h & 7U) * 8;
  __s = pcVar6 + lVar10;
  if (core->affine_flag == 0) {
    paasVar12 = (core->map).map_mv;
    if (uVar1 < 2) {
      if (uVar1 == 1) {
        if (iVar31 != 0x1f) {
          aasVar55 = *&core->mv;
          iVar31 = 1;
          if (1 < iVar25) {
            iVar31 = iVar25;
          }
          do {
            local_100 = local_100 + lVar21;
            *(ushort *)(pcVar6 + lVar10) = CONCAT11(cVar16,cVar16);
            *(uint *)(pasVar4 + lVar10) = CONCAT22(asVar3,asVar3);
            paasVar12[lVar10] = aasVar55;
            paasVar12[lVar10 + 1] = aasVar55;
            puVar5[(ulong)(uVar8 - 1) + lVar10] = uVar38;
            lVar10 = lVar10 + lVar21;
            iVar31 = iVar31 + -1;
          } while (iVar31 != 0);
        }
      }
      else if (iVar31 != 0x1f) {
        iVar31 = 1;
        if (1 < iVar25) {
          iVar31 = iVar25;
        }
        do {
          pcVar6[lVar10] = cVar16;
          pasVar4[lVar10] = asVar3;
          paasVar12[lVar10] = *&core->mv;
          *local_100 = uVar38;
          lVar10 = lVar10 + lVar21;
          local_100 = local_100 + lVar21;
          iVar31 = iVar31 + -1;
        } while (iVar31 != 0);
      }
    }
    else if (iVar31 != 0x1f) {
      paasVar12 = paasVar12 + lVar10;
      aasVar55 = *&core->mv;
      iVar31 = 1;
      if (1 < iVar25) {
        iVar31 = iVar25;
      }
      iVar25 = 0;
      do {
        if (uVar1 != 0x1f) {
          lVar10 = 0;
          do {
            *(uint *)(__s + lVar10) = (uint)(byte)cVar16 * 0x1010101;
            *(ulong *)(pasVar22 + lVar10) = (ulong)(ushort)asVar3 * 0x1000100010001;
            paasVar12[lVar10] = aasVar55;
            paasVar12[lVar10 + 1] = aasVar55;
            paasVar12[lVar10 + 2] = aasVar55;
            paasVar12[lVar10 + 3] = aasVar55;
            lVar10 = lVar10 + 4;
          } while (lVar10 < (int)uVar8);
        }
        local_100[(int)(uVar8 - 1)] = uVar38;
        local_100 = local_100 + lVar21;
        iVar25 = iVar25 + 1;
        paasVar12 = paasVar12 + lVar21;
        pasVar22 = pasVar22 + lVar21;
        __s = __s + lVar21;
      } while (iVar25 != iVar31);
    }
  }
  else {
    if (iVar31 != 0x1f) {
      uVar51 = 1;
      if (1 < (int)uVar8) {
        uVar51 = (ulong)uVar8;
      }
      iVar31 = 1;
      if (1 < iVar25) {
        iVar31 = iVar25;
      }
      iVar25 = 0;
      do {
        memset(__s,(uint)(byte)cVar16,(long)(int)uVar8);
        if (uVar1 != 0x1f) {
          uVar11 = 0;
          do {
            pasVar22[uVar11] = asVar3;
            uVar11 = uVar11 + 1;
          } while (uVar51 != uVar11);
        }
        local_100[(int)(uVar8 - 1)] = uVar38;
        local_100 = local_100 + lVar21;
        __s = __s + lVar21;
        iVar25 = iVar25 + 1;
        pasVar22 = pasVar22 + lVar21;
      } while (iVar25 != iVar31);
    }
    bVar46 = (byte)core->cu_log2w;
    uVar17 = (1 << (bVar46 & 0x1f)) >> 2;
    bVar56 = (byte)core->cu_log2h;
    iVar31 = (1 << (bVar56 & 0x1f)) >> 2;
    uVar2 = core->affine_flag;
    if ((core->refi[0] < '\0') || (core->refi[1] < '\0')) {
      bVar7 = (byte)core->refi[0] >> 7;
      iVar25 = core->affine_mv[bVar7][0][0];
      iVar43 = (core->affine_mv[bVar7][1][0] - iVar25) * 0x80 >> (bVar46 & 0x1f);
      iVar40 = core->affine_mv[bVar7][0][1];
      iVar58 = (core->affine_mv[bVar7][1][1] - iVar40) * 0x80 >> (bVar46 & 0x1f);
      if (uVar2 == '\x02') {
        iVar39 = (core->affine_mv[bVar7][2][0] - iVar25) * 0x80 >> (bVar56 & 0x1f);
        iVar20 = (core->affine_mv[bVar7][2][1] - iVar40) * 0x80 >> (bVar56 & 0x1f);
      }
      else {
        iVar39 = -iVar58;
        iVar20 = iVar43;
      }
      local_138 = core->affine_sb_mv + bVar7;
      paasVar12 = (core->map).map_mv;
      uVar49 = iVar25 * 0x80;
      uVar24 = iVar40 * 0x80;
      if (core->pichdr->affine_subblock_size_idx == 1) {
        if (0 < iVar31) {
          uVar27 = uVar49 + iVar39 * 4 + iVar43 * 4;
          uVar28 = uVar24 + iVar20 * 4 + iVar58 * 4;
          lVar42 = (long)paasVar12[1][0] + (lVar21 * 8 + lVar10 * 8 | (ulong)bVar7 * 4);
          pasVar13 = paasVar12[lVar10 + 1] + bVar7;
          iVar25 = 0;
          do {
            if (0 < (int)uVar17) {
              lVar10 = 0;
              lVar50 = 0;
              uVar29 = uVar27;
              uVar30 = uVar28;
              do {
                uVar44 = uVar24;
                uVar53 = uVar49;
                if (((iVar25 != 0 || (int)lVar50 != 0) &&
                    ((iVar25 != 0 ||
                     (uVar44 = (iVar58 << (bVar46 & 0x1f)) + uVar24,
                     uVar53 = (iVar43 << (bVar46 & 0x1f)) + uVar49, (ulong)uVar17 - 2 != lVar50))))
                   && (uVar44 = (iVar20 << (bVar56 & 0x1f)) + uVar24,
                      uVar53 = (iVar39 << (bVar56 & 0x1f)) + uVar49,
                      (iVar25 + 2 != iVar31 || uVar2 != '\x02') || lVar50 != 0)) {
                  uVar44 = uVar30;
                  uVar53 = uVar29;
                }
                uVar37 = 0;
                uVar23 = 0;
                if (uVar53 != 0) {
                  if ((int)uVar53 < 1) {
                    uVar53 = 0x40 - uVar53 >> 7;
                    uVar23 = -uVar53;
                    if ((int)uVar23 < -0x1ffff) {
                      uVar23 = 0xfffe0000;
                    }
                    iVar40 = -(uVar53 + 2 >> 2);
                    uVar37 = (ushort)iVar40;
                    if (iVar40 < -0x7fff) {
                      uVar37 = 0x8000;
                    }
                  }
                  else {
                    uVar23 = uVar53 + 0x40 >> 7;
                    if (0xffffbf < uVar53) {
                      uVar23 = 0x1ffff;
                    }
                    uVar53 = uVar23 + 2 >> 2;
                    if (0x7ffe < uVar53) {
                      uVar53 = 0x7fff;
                    }
                    uVar37 = (ushort)uVar53;
                  }
                }
                uVar48 = 0;
                uVar53 = 0;
                if (uVar44 != 0) {
                  if ((int)uVar44 < 1) {
                    uVar44 = 0x40 - uVar44 >> 7;
                    uVar48 = -uVar44;
                    if ((int)uVar48 < -0x1ffff) {
                      uVar48 = 0xfffe0000;
                    }
                    uVar53 = -(uVar44 + 2 >> 2);
                    if ((int)uVar53 < -0x7fff) {
                      uVar53 = 0xffff8000;
                    }
                  }
                  else {
                    uVar48 = uVar44 + 0x40 >> 7;
                    if (0xffffbf < uVar44) {
                      uVar48 = 0x1ffff;
                    }
                    uVar53 = uVar48 + 2 >> 2;
                    if (0x7ffe < uVar53) {
                      uVar53 = 0x7fff;
                    }
                  }
                }
                asVar41 = (s16  [2])((uint)uVar37 | uVar53 << 0x10);
                pasVar13[lVar50 * 2 + -2] = asVar41;
                pasVar13[lVar50 * 2] = asVar41;
                *(s16 (*) [2])(lVar42 + -8 + lVar50 * 8) = asVar41;
                *(s16 (*) [2])(lVar42 + lVar50 * 8) = asVar41;
                *(ulong *)((*local_138)[0] + lVar50) = CONCAT44(uVar48,uVar23);
                lVar50 = lVar50 + 2;
                uVar29 = uVar29 + iVar43 * 8;
                uVar30 = uVar30 + iVar58 * 8;
                lVar10 = lVar10 + -8;
              } while (lVar50 < (int)uVar17);
              local_138 = (s32 (*) [1024] [2])((long)local_138 - lVar10);
            }
            iVar25 = iVar25 + 2;
            uVar27 = uVar27 + iVar39 * 8;
            uVar28 = uVar28 + iVar20 * 8;
            lVar42 = lVar42 + (long)(iVar32 * 2) * 8;
            pasVar13 = pasVar13 + (long)(iVar32 * 2) * 2;
          } while (iVar25 < iVar31);
        }
      }
      else if (0 < iVar31) {
        uVar27 = uVar49 + iVar39 * 2 + iVar43 * 2;
        uVar28 = uVar24 + iVar20 * 2 + iVar58 * 2;
        pasVar13 = paasVar12[lVar10] + bVar7;
        iVar25 = 0;
        do {
          if (0 < (int)uVar17) {
            lVar10 = 0;
            uVar51 = 0;
            uVar29 = uVar28;
            uVar30 = uVar27;
            do {
              uVar44 = uVar24;
              uVar53 = uVar49;
              if ((iVar25 != 0 || (int)uVar51 != 0) &&
                 (((iVar25 != 0 ||
                   (uVar44 = (iVar58 << (bVar46 & 0x1f)) + uVar24,
                   uVar53 = (iVar43 << (bVar46 & 0x1f)) + uVar49, uVar17 - 1 != uVar51)) &&
                  (uVar44 = (iVar20 << (bVar56 & 0x1f)) + uVar24,
                  uVar53 = (iVar39 << (bVar56 & 0x1f)) + uVar49,
                  (iVar25 != iVar31 + -1 || uVar2 != '\x02') || uVar51 != 0)))) {
                uVar44 = uVar29;
                uVar53 = uVar30;
              }
              uVar37 = 0;
              uVar23 = 0;
              if (uVar53 != 0) {
                if ((int)uVar53 < 1) {
                  uVar53 = 0x40 - uVar53 >> 7;
                  uVar23 = -uVar53;
                  if ((int)uVar23 < -0x1ffff) {
                    uVar23 = 0xfffe0000;
                  }
                  iVar32 = -(uVar53 + 2 >> 2);
                  uVar37 = (ushort)iVar32;
                  if (iVar32 < -0x7fff) {
                    uVar37 = 0x8000;
                  }
                }
                else {
                  uVar23 = uVar53 + 0x40 >> 7;
                  if (0xffffbf < uVar53) {
                    uVar23 = 0x1ffff;
                  }
                  uVar53 = uVar23 + 2 >> 2;
                  if (0x7ffe < uVar53) {
                    uVar53 = 0x7fff;
                  }
                  uVar37 = (ushort)uVar53;
                }
              }
              uVar11 = 0;
              uVar53 = 0;
              if (uVar44 != 0) {
                if ((int)uVar44 < 1) {
                  uVar53 = 0x40 - uVar44 >> 7;
                  uVar44 = -uVar53;
                  if ((int)uVar44 < -0x1ffff) {
                    uVar44 = 0xfffe0000;
                  }
                  uVar11 = (ulong)uVar44;
                  uVar53 = -(uVar53 + 2 >> 2);
                  if ((int)uVar53 < -0x7fff) {
                    uVar53 = 0xffff8000;
                  }
                }
                else {
                  uVar53 = uVar44 + 0x40 >> 7;
                  if (0xffffbf < uVar44) {
                    uVar53 = 0x1ffff;
                  }
                  uVar11 = (ulong)uVar53;
                  uVar53 = uVar53 + 2 >> 2;
                  if (0x7ffe < uVar53) {
                    uVar53 = 0x7fff;
                  }
                }
              }
              pasVar13[uVar51 * 2] = (s16  [2])((uint)uVar37 | uVar53 << 0x10);
              (*local_138)[uVar51] = (s32  [2])((ulong)uVar23 | uVar11 << 0x20);
              uVar51 = uVar51 + 1;
              uVar30 = uVar30 + iVar43 * 4;
              uVar29 = uVar29 + iVar58 * 4;
              lVar10 = lVar10 + -8;
            } while (uVar17 != uVar51);
            local_138 = (s32 (*) [1024] [2])((long)local_138 - lVar10);
          }
          iVar25 = iVar25 + 1;
          uVar27 = uVar27 + iVar39 * 4;
          uVar28 = uVar28 + iVar20 * 4;
          pasVar13 = pasVar13 + lVar21 * 2;
        } while (iVar25 != iVar31);
      }
    }
    else {
      iVar25 = core->affine_mv[0][0][0];
      iVar40 = core->affine_mv[0][0][1];
      iVar20 = (core->affine_mv[0][1][0] - iVar25) * 0x80 >> (bVar46 & 0x1f);
      iVar39 = (core->affine_mv[0][1][1] - iVar40) * 0x80 >> (bVar46 & 0x1f);
      iVar43 = core->affine_mv[1][0][0];
      iVar58 = core->affine_mv[1][0][1];
      iVar57 = (core->affine_mv[1][1][0] - iVar43) * 0x80 >> (bVar46 & 0x1f);
      iVar47 = (core->affine_mv[1][1][1] - iVar58) * 0x80 >> (bVar46 & 0x1f);
      if (uVar2 == '\x02') {
        iVar14 = (core->affine_mv[0][2][0] - iVar25) * 0x80 >> (bVar56 & 0x1f);
        iVar26 = (core->affine_mv[0][2][1] - iVar40) * 0x80 >> (bVar56 & 0x1f);
        iVar15 = (core->affine_mv[1][2][0] - iVar43) * 0x80 >> (bVar56 & 0x1f);
        iVar18 = (core->affine_mv[1][2][1] - iVar58) * 0x80 >> (bVar56 & 0x1f);
      }
      else {
        iVar14 = -iVar39;
        iVar15 = -iVar47;
        iVar18 = iVar57;
        iVar26 = iVar20;
      }
      if (0 < iVar31) {
        local_110 = (core->map).map_mv;
        local_d8 = local_110 + lVar10;
        local_e8 = core->affine_sb_mv;
        uVar29 = iVar25 * 0x80;
        uVar53 = iVar40 * 0x80;
        paasVar52 = core->affine_sb_mv + 1;
        uVar27 = iVar43 * 0x80;
        uVar28 = iVar58 * 0x80;
        uVar24 = uVar29 + iVar14 * 4 + iVar20 * 4;
        uVar49 = uVar53 + iVar26 * 4 + iVar39 * 4;
        local_110 = local_110 + lVar10 + lVar21 + 1;
        uVar30 = uVar27 + iVar15 * 4 + iVar57 * 4;
        uVar44 = uVar28 + iVar18 * 4 + iVar47 * 4;
        iVar25 = 0;
        do {
          if (0 < (int)uVar17) {
            lVar42 = 0;
            lVar10 = 0;
            uVar45 = uVar44;
            uVar23 = uVar24;
            uVar48 = uVar49;
            uVar59 = uVar30;
            do {
              uVar19 = uVar29;
              uVar9 = uVar53;
              uVar34 = uVar27;
              uVar35 = uVar28;
              if (((iVar25 != 0 || (int)lVar10 != 0) &&
                  ((iVar25 != 0 ||
                   (uVar19 = (iVar20 << (bVar46 & 0x1f)) + uVar29,
                   uVar9 = (iVar39 << (bVar46 & 0x1f)) + uVar53,
                   uVar34 = (iVar57 << (bVar46 & 0x1f)) + uVar27,
                   uVar35 = (iVar47 << (bVar46 & 0x1f)) + uVar28, (ulong)uVar17 - 2 != lVar10)))) &&
                 (uVar19 = (iVar14 << (bVar56 & 0x1f)) + uVar29,
                 uVar9 = (iVar26 << (bVar56 & 0x1f)) + uVar53,
                 uVar34 = (iVar15 << (bVar56 & 0x1f)) + uVar27,
                 uVar35 = (iVar18 << (bVar56 & 0x1f)) + uVar28,
                 lVar10 != 0 || (iVar25 + 2 != iVar31 || uVar2 != '\x02'))) {
                uVar19 = uVar23;
                uVar9 = uVar48;
                uVar34 = uVar59;
                uVar35 = uVar45;
              }
              uVar33 = 0;
              uVar54 = 0;
              if (uVar19 != 0) {
                if ((int)uVar19 < 1) {
                  uVar19 = 0x40 - uVar19 >> 7;
                  uVar33 = -uVar19;
                  if ((int)uVar33 < -0x1ffff) {
                    uVar33 = 0xfffe0000;
                  }
                  uVar54 = -(uVar19 + 2 >> 2);
                  if ((int)uVar54 < -0x7fff) {
                    uVar54 = 0xffff8000;
                  }
                }
                else {
                  uVar33 = uVar19 + 0x40 >> 7;
                  if (0xffffbf < uVar19) {
                    uVar33 = 0x1ffff;
                  }
                  uVar54 = uVar33 + 2 >> 2;
                  if (0x7ffe < uVar54) {
                    uVar54 = 0x7fff;
                  }
                }
              }
              uVar51 = (ulong)uVar33;
              uVar19 = 0;
              if (uVar9 != 0) {
                if ((int)uVar9 < 1) {
                  uVar9 = 0x40 - uVar9 >> 7;
                  uVar19 = -uVar9;
                  uVar11 = (ulong)uVar19;
                  if ((int)uVar19 < -0x1ffff) {
                    uVar11 = 0xfffe0000;
                  }
                  uVar51 = uVar51 | uVar11 << 0x20;
                  uVar19 = -(uVar9 + 2 >> 2);
                  if ((int)uVar19 < -0x7fff) {
                    uVar19 = 0xffff8000;
                  }
                }
                else {
                  uVar19 = uVar9 + 0x40 >> 7;
                  if (0xffffbf < uVar9) {
                    uVar19 = 0x1ffff;
                  }
                  uVar51 = CONCAT44(uVar19,uVar33);
                  uVar19 = uVar19 + 2 >> 2;
                  if (0x7ffe < uVar19) {
                    uVar19 = 0x7fff;
                  }
                }
              }
              uVar36 = 0;
              uVar11 = 0;
              uVar9 = 0;
              if (uVar34 != 0) {
                if ((int)uVar34 < 1) {
                  uVar34 = 0x40 - uVar34 >> 7;
                  uVar9 = -uVar34;
                  if ((int)uVar9 < -0x1ffff) {
                    uVar9 = 0xfffe0000;
                  }
                  uVar11 = (ulong)uVar9;
                  uVar9 = -(uVar34 + 2 >> 2);
                  if ((int)uVar9 < -0x7fff) {
                    uVar9 = 0xffff8000;
                  }
                }
                else {
                  uVar9 = uVar34 + 0x40 >> 7;
                  if (0xffffbf < uVar34) {
                    uVar9 = 0x1ffff;
                  }
                  uVar11 = (ulong)uVar9;
                  uVar9 = uVar9 + 2 >> 2;
                  if (0x7ffe < uVar9) {
                    uVar9 = 0x7fff;
                  }
                }
              }
              if (uVar35 != 0) {
                if ((int)uVar35 < 1) {
                  uVar35 = 0x40 - uVar35 >> 7;
                  uVar34 = -uVar35;
                  uVar36 = (ulong)uVar34;
                  if ((int)uVar34 < -0x1ffff) {
                    uVar36 = 0xfffe0000;
                  }
                  uVar11 = uVar11 | uVar36 << 0x20;
                  uVar34 = -(uVar35 + 2 >> 2);
                  uVar36 = (ulong)uVar34;
                  if ((int)uVar34 < -0x7fff) {
                    uVar36 = 0xffff8000;
                  }
                }
                else {
                  uVar34 = uVar35 + 0x40 >> 7;
                  if (0xffffbf < uVar35) {
                    uVar34 = 0x1ffff;
                  }
                  uVar11 = uVar11 | (ulong)uVar34 << 0x20;
                  uVar34 = uVar34 + 2 >> 2;
                  if (0x7ffe < uVar34) {
                    uVar34 = 0x7fff;
                  }
                  uVar36 = (ulong)uVar34;
                }
              }
              aasVar55 = (s16  [2] [2])
                         ((ulong)(uVar54 & 0xffff) |
                         (ulong)(uVar19 << 0x10) | (ulong)(uVar9 & 0xffff) << 0x20 | uVar36 << 0x30)
              ;
              local_d8[lVar10] = aasVar55;
              local_d8[lVar10 + 1] = aasVar55;
              local_110[lVar10 + -1] = aasVar55;
              local_110[lVar10] = aasVar55;
              *(ulong *)((*local_e8)[0] + lVar10) = uVar51;
              *(ulong *)((*paasVar52)[0] + lVar10) = uVar11;
              lVar10 = lVar10 + 2;
              uVar23 = uVar23 + iVar20 * 8;
              uVar48 = uVar48 + iVar39 * 8;
              uVar59 = uVar59 + iVar57 * 8;
              uVar45 = uVar45 + iVar47 * 8;
              lVar42 = lVar42 + -8;
            } while (lVar10 < (int)uVar17);
            local_e8 = (s32 (*) [1024] [2])((long)local_e8 - lVar42);
            paasVar52 = (s32 (*) [1024] [2])((long)paasVar52 - lVar42);
          }
          iVar25 = iVar25 + 2;
          uVar24 = uVar24 + iVar14 * 8;
          uVar49 = uVar49 + iVar26 * 8;
          uVar30 = uVar30 + iVar15 * 8;
          uVar44 = uVar44 + iVar18 * 8;
          local_110 = local_110 + iVar32 * 2;
          local_d8 = local_d8 + iVar32 * 2;
        } while (iVar25 < iVar31);
      }
    }
  }
  if (uVar1 != 0x1f) {
    uVar51 = 1;
    if (1 < (int)uVar8) {
      uVar51 = (ulong)uVar8;
    }
    uVar11 = 0;
    do {
      local_100[uVar11 - lVar21] = uVar38;
      uVar11 = uVar11 + 1;
    } while (uVar51 != uVar11);
  }
  return;
}

Assistant:

void dec_update_map(com_core_t * core)
{
    int i, j;
    int scup  = core->cu_scup;
    int i_scu = core->seqhdr->i_scu;
    int w_cu = 1 << (core->cu_log2w - MIN_CU_LOG2);
    int h_cu = 1 << (core->cu_log2h - MIN_CU_LOG2);
    s8  (*map_refi)[REFP_NUM]       = core->map.map_refi + scup;
    s16 (*map_mv)  [REFP_NUM][MV_D] = core->map.map_mv   + scup;
    u32  *map_pos                   = core->map.map_pos  + scup;
    com_scu_t *map_scu              = core->map.map_scu  + scup;
    u32 cu_pos = 0;
    com_scu_t scu = { 0 };
    s16 (*mv)[MV_D] = core->mv;
    u16 refi = M16(core->refi);
    
    scu.coded  = 1;
    scu.intra  = core->cu_mode == MODE_INTRA;
    scu.inter  = !scu.intra;
    scu.affine = core->affine_flag;
    scu.skip   = core->cu_mode == MODE_SKIP;
    scu.cbf = M32(core->cbfy) || M16(core->cbfc) || scu.intra; // only used for deblock

    MCU_SET_LOGW(cu_pos, core->cu_log2w);
    MCU_SET_LOGH(cu_pos, core->cu_log2h);
    MCU_SET_SCUP(cu_pos, core->cu_scup);

    if (core->affine_flag) {
        for (i = 0; i < h_cu; i++) {
            memset(map_scu, *(u8*)&scu, w_cu);
            for (j = 0; j < w_cu; j++) {
                M16(map_refi[j]) = refi;
            }
            map_pos[w_cu - 1] = cu_pos;
            map_refi += i_scu;
            map_mv   += i_scu;
            map_pos  += i_scu;
            map_scu  += i_scu;
        }
        set_affine_mvf(core, scup, core->cu_log2w, core->cu_log2h, i_scu, &core->map, core->pichdr);
    } else {
        if ((w_cu & 3) == 0) {
            u64 refi_64 = refi * 0x0001000100010001;
            u32 scu_32 = (*(u8*)&scu) * 0x01010101;
            uavs3d_union128_t mv_128 = { M64(mv), M64(mv) };

            for (i = 0; i < h_cu; i++) {
                for (j = 0; j < w_cu; j += 4) {
                    M32(map_scu + j) = scu_32;
                    M64(map_refi + j) = refi_64;
                    CP128(map_mv + j, &mv_128);
                    CP128(map_mv + j + 2, &mv_128);
                }
                map_pos[w_cu - 1] = cu_pos;
                map_refi += i_scu;
                map_mv   += i_scu;
                map_pos  += i_scu;
                map_scu  += i_scu;
            }
        } else if ((w_cu & 1) == 0) {
            u32 refi_32 = refi * 0x00010001;
            u16 scu_16 = (*(u8*)&scu) * 0x0101;
            uavs3d_union128_t mv_128 = { M64(mv), M64(mv) };

            for (i = 0; i < h_cu; i++) {
                M16(map_scu) = scu_16;
                M32(map_refi) = refi_32;
                CP128(map_mv, &mv_128);
                map_pos[w_cu - 1] = cu_pos;
                map_refi += i_scu;
                map_mv   += i_scu;
                map_pos  += i_scu;
                map_scu  += i_scu;
            }
        } else {
            for (i = 0; i < h_cu; i++) {
                *map_scu = scu;
                M16(map_refi) = refi;
                CP64(map_mv, mv);
                map_pos[0] = cu_pos;
                map_refi += i_scu;
                map_mv   += i_scu;
                map_pos  += i_scu;
                map_scu  += i_scu;
            }
        }
    }

    map_pos -= i_scu;

    for (j = 0; j < w_cu; j++) {
        map_pos[j] = cu_pos;
    }
}